

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O1

void __thiscall LTAircraft::~LTAircraft(LTAircraft *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Aircraft)._vptr_Aircraft = (_func_int **)&PTR__LTAircraft_002de7a8;
  if (pExtViewAc == this) {
    ToggleCameraView(this);
  }
  DataRefs::DecNumAc(&dataRefs);
  if ((int)dataRefs.iLogLevel < 2) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
           ,0x534,"~LTAircraft",logINFO,"Removed aircraft %s",(this->labelInternal)._M_dataplus._M_p
          );
  }
  pcVar2 = (this->nearestAirport)._M_dataplus._M_p;
  paVar1 = &(this->nearestAirport).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->labelInternal)._M_dataplus._M_p;
  paVar1 = &(this->labelInternal).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::_Deque_base<positionTy,_std::allocator<positionTy>_>::~_Deque_base
            (&(this->posList).super__Deque_base<positionTy,_std::allocator<positionTy>_>);
  XPMP2::Aircraft::~Aircraft(&this->super_Aircraft);
  return;
}

Assistant:

LTAircraft::~LTAircraft()
{
    // make sure external view doesn't use this aircraft any longer
    if (IsInCameraView())
        ToggleCameraView();
    
    // Decrease number of visible aircraft and log a message about that fact
    dataRefs.DecNumAc();
    LOG_MSG(logINFO,INFO_AC_REMOVED,labelInternal.c_str());
}